

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_code.hpp
# Opt level: O1

int __thiscall
system_error2::status_code<system_error2::detail::erased<long,_true>_>::clone
          (status_code<system_error2::detail::erased<long,_true>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  status_code_domain *psVar1;
  char cVar2;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [48];
  
  psVar1 = (this->
           super_mixin<system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>,_system_error2::detail::erased<long,_true>_>
           ).super_status_code_storage<system_error2::detail::erased<long,_true>_>.
           super_status_code<void>._domain;
  local_58 = 0;
  uStack_50 = 0;
  if (psVar1 != (status_code_domain *)0x0) {
    (**(code **)(*(long *)psVar1 + 8))(local_48,psVar1,__child_stack,___flags);
    cVar2 = (**(code **)(*(long *)psVar1 + 0x38))(psVar1,&local_58,this);
    if (cVar2 == '\0') {
      abort();
    }
  }
  return (int)local_58;
}

Assistant:

SYSTEM_ERROR2_CONSTEXPR20 status_code clone() const
  {
    if(nullptr == this->_domain)
    {
      return {};
    }
    status_code x;
    if(!this->_domain->_do_erased_copy(x, *this, this->_domain->payload_info()))
    {
      abort();  // should not be possible
    }
    return x;
  }